

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

uint * __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::erase(SmallVector<unsigned_int,_8UL> *this,uint *itr)

{
  uint *__last;
  uint *itr_local;
  SmallVector<unsigned_int,_8UL> *this_local;
  
  __last = VectorView<unsigned_int>::end(&this->super_VectorView<unsigned_int>);
  ::std::move<unsigned_int*,unsigned_int*>(itr + 1,__last,itr);
  (this->super_VectorView<unsigned_int>).buffer_size =
       (this->super_VectorView<unsigned_int>).buffer_size - 1;
  return itr;
}

Assistant:

T *erase(T *itr) SPIRV_CROSS_NOEXCEPT
	{
		std::move(itr + 1, this->end(), itr);
		this->ptr[--this->buffer_size].~T();
		return itr;
	}